

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int push_signature_algorithms(ptls_verify_certificate_t *vc,ptls_buffer_t *sendbuf)

{
  ushort uVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  uint16_t *puVar5;
  ushort local_2a;
  
  iVar3 = ptls_buffer__do_pushv(sendbuf,"",2);
  if (iVar3 == 0) {
    if (vc == (ptls_verify_certificate_t *)0x0) {
      puVar5 = push_signature_algorithms::default_algos;
    }
    else {
      puVar5 = vc->algos;
    }
    sVar2 = sendbuf->off;
    do {
      uVar1 = *puVar5;
      if (uVar1 == 0xffff) {
        lVar4 = sendbuf->off - sVar2;
        sendbuf->base[sVar2 - 2] = (uint8_t)((ulong)lVar4 >> 8);
        sendbuf->base[sVar2 - 1] = (uint8_t)lVar4;
        return 0;
      }
      local_2a = uVar1 << 8 | uVar1 >> 8;
      iVar3 = ptls_buffer__do_pushv(sendbuf,&local_2a,2);
      puVar5 = puVar5 + 1;
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

static int push_signature_algorithms(ptls_verify_certificate_t *vc, ptls_buffer_t *sendbuf)
{
    /* The list sent when verify callback is not registered */
    static const uint16_t default_algos[] = {PTLS_SIGNATURE_RSA_PSS_RSAE_SHA256, PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256,
                                             PTLS_SIGNATURE_RSA_PKCS1_SHA256, PTLS_SIGNATURE_RSA_PKCS1_SHA1, UINT16_MAX};
    int ret;

    ptls_buffer_push_block(sendbuf, 2, {
        for (const uint16_t *p = vc != NULL ? vc->algos : default_algos; *p != UINT16_MAX; ++p)
            ptls_buffer_push16(sendbuf, *p);
    });

    ret = 0;
Exit:
    return ret;
}